

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solbase.h
# Opt level: O1

SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator=(SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            *this,SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *sol)

{
  byte bVar1;
  long lVar2;
  cpp_dec_float<200U,_int,_void> *pcVar3;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  *pSVar4;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  bVar1 = 0;
  if ((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != sol) {
    this[0x110] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   )((byte)this[0x110] & 0xfe | sol->field_0xd0 & 1);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)this,&sol->_primal);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)(this + 0x18),&sol->_slacks);
    local_a8.fpclass = cpp_dec_float_finite;
    local_a8.prec_elem = 0x1c;
    local_a8.data._M_elems[0] = 0;
    local_a8.data._M_elems[1] = 0;
    local_a8.data._M_elems[2] = 0;
    local_a8.data._M_elems[3] = 0;
    local_a8.data._M_elems[4] = 0;
    local_a8.data._M_elems[5] = 0;
    local_a8.data._M_elems[6] = 0;
    local_a8.data._M_elems[7] = 0;
    local_a8.data._M_elems[8] = 0;
    local_a8.data._M_elems[9] = 0;
    local_a8.data._M_elems[10] = 0;
    local_a8.data._M_elems[0xb] = 0;
    local_a8.data._M_elems[0xc] = 0;
    local_a8.data._M_elems[0xd] = 0;
    local_a8.data._M_elems[0xe] = 0;
    local_a8.data._M_elems[0xf] = 0;
    local_a8.data._M_elems[0x10] = 0;
    local_a8.data._M_elems[0x11] = 0;
    local_a8.data._M_elems[0x12] = 0;
    local_a8.data._M_elems[0x13] = 0;
    local_a8.data._M_elems[0x14] = 0;
    local_a8.data._M_elems[0x15] = 0;
    local_a8.data._M_elems[0x16] = 0;
    local_a8.data._M_elems[0x17] = 0;
    local_a8.data._M_elems[0x18] = 0;
    local_a8.data._M_elems[0x19] = 0;
    local_a8.data._M_elems._104_5_ = 0;
    local_a8.data._M_elems[0x1b]._1_3_ = 0;
    local_a8.exp = 0;
    local_a8.neg = false;
    boost::multiprecision::detail::
    generic_convert_rational_to_float<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
              (&local_a8,&(sol->_objVal).m_backend);
    pcVar3 = &local_a8;
    pSVar4 = this + 0x90;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pSVar4 = *(undefined4 *)pcVar3;
      pcVar3 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar3 + ((ulong)bVar1 * -2 + 1) * 4);
      pSVar4 = pSVar4 + (ulong)bVar1 * -8 + 4;
    }
    *(int *)(this + 0x100) = local_a8.exp;
    this[0x104] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   )local_a8.neg;
    *(undefined8 *)(this + 0x108) = local_a8._120_8_;
    bVar1 = sol->field_0xd0 & 2;
    this[0x110] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   )((byte)this[0x110] & 0xfd | bVar1);
    if (bVar1 != 0) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)(this + 0x30),&sol->_primalRay);
    }
    this[0x110] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   )((byte)this[0x110] & 0xfb | sol->field_0xd0 & 4);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)(this + 0x48),&sol->_dual);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 *)(this + 0x60),&sol->_redCost);
    bVar1 = sol->field_0xd0 & 8;
    this[0x110] = (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   )((byte)this[0x110] & 0xf7 | bVar1);
    if (bVar1 != 0) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)(this + 0x78),&sol->_dualFarkas);
    }
  }
  return (SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

SolBase<R>& operator=(const SolBase<S>& sol)
   {
      if((SolBase<S>*)this != &sol)
      {

         _isPrimalFeasible = sol._isPrimalFeasible;
         _primal = sol._primal;
         _slacks = sol._slacks;

         _objVal = R(sol._objVal);

         _hasPrimalRay = sol._hasPrimalRay;

         if(_hasPrimalRay)
            _primalRay = sol._primalRay;

         _isDualFeasible = sol._isDualFeasible;
         _dual = sol._dual;
         _redCost = sol._redCost;

         _hasDualFarkas = sol._hasDualFarkas;

         if(_hasDualFarkas)
            _dualFarkas = sol._dualFarkas;
      }

      return *this;
   }